

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

json_node_t * __thiscall shine::json_node_t::find_kv_child(json_node_t *this,string *key)

{
  _Rb_tree<shine::string,_std::pair<const_shine::string,_shine::json_node_t>,_std::_Select1st<std::pair<const_shine::string,_shine::json_node_t>_>,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>
  *this_00;
  iterator iVar1;
  
  if (this->_type != '\x05') {
    return (json_node_t *)0x0;
  }
  this_00 = &((this->_kv_childs).
              super___shared_ptr<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_t;
  if ((this_00 !=
       (_Rb_tree<shine::string,_std::pair<const_shine::string,_shine::json_node_t>,_std::_Select1st<std::pair<const_shine::string,_shine::json_node_t>_>,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>
        *)0x0) &&
     (iVar1 = std::
              _Rb_tree<shine::string,_std::pair<const_shine::string,_shine::json_node_t>,_std::_Select1st<std::pair<const_shine::string,_shine::json_node_t>_>,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>
              ::find(this_00,key),
     (_Rb_tree_header *)iVar1._M_node !=
     &(((this->_kv_childs).
        super___shared_ptr<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header)) {
    return (json_node_t *)(iVar1._M_node + 2);
  }
  return (json_node_t *)0x0;
}

Assistant:

json_node_t *find_kv_child(const string &key) {
            if (get_type() != e_object)
                return nullptr;

            if (get_kv_childs())
            {
                auto iter = get_kv_childs()->find(key);
                if (iter != get_kv_childs()->end())
                    return &iter->second;
            }

            return nullptr;
        }